

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O0

int __thiscall
TPZSparseBlockDiagonal<std::complex<float>_>::PutVal
          (TPZSparseBlockDiagonal<std::complex<float>_> *this,int64_t row,int64_t col,
          complex<float> *value)

{
  int iVar1;
  int *piVar2;
  long *plVar3;
  complex<float> *pcVar4;
  _ComplexT *in_RCX;
  long in_RDI;
  int64_t pos;
  int64_t cblockindex;
  int64_t cblock;
  int64_t rblockindex;
  int64_t rblock;
  int64_t *in_stack_ffffffffffffffb8;
  TPZSparseBlockDiagonal<std::complex<float>_> *in_stack_ffffffffffffffc0;
  long in_stack_ffffffffffffffc8;
  TPZSparseBlockDiagonal<std::complex<float>_> *in_stack_ffffffffffffffd0;
  int local_4;
  
  FindBlockIndex(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                 (int64_t *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (in_stack_ffffffffffffffd0 ==
      (TPZSparseBlockDiagonal<std::complex<float>_> *)0xffffffffffffffff) {
    local_4 = -1;
  }
  else {
    FindBlockIndex(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                   (int64_t *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (in_stack_ffffffffffffffc0 == in_stack_ffffffffffffffd0) {
      piVar2 = TPZVec<int>::operator[]
                         ((TPZVec<int> *)(in_RDI + 0x60),(int64_t)in_stack_ffffffffffffffd0);
      iVar1 = *piVar2;
      plVar3 = TPZVec<long>::operator[]
                         ((TPZVec<long> *)(in_RDI + 0x40),(int64_t)in_stack_ffffffffffffffd0);
      pcVar4 = TPZVec<std::complex<float>_>::operator[]
                         ((TPZVec<std::complex<float>_> *)(in_RDI + 0x20),
                          *plVar3 + in_stack_ffffffffffffffc8 +
                                    (long)in_stack_ffffffffffffffb8 * (long)iVar1);
      pcVar4->_M_value = *in_RCX;
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int TPZSparseBlockDiagonal<TVar>::PutVal(const int64_t row, const int64_t col, const TVar& value)
{
	int64_t rblock,rblockindex,cblock,cblockindex;
	FindBlockIndex(row,rblock,rblockindex);
	if(rblock == -1) return -1;
	FindBlockIndex(col,cblock,cblockindex);
	if(cblock != rblock) return -1;
	int64_t pos = rblockindex + cblockindex*this->fBlockSize[rblock];
	this->fStorage[this->fBlockPos[rblock]+pos] = value;
	return 0;
}